

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__half2x2
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__half2x2( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__half2x2( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}